

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCASerialization.cpp
# Opt level: O2

void Js::SCASerializationEngine::Serialize
               (Var root,StreamWriter *writer,Var *transferableVars,size_t cTransferableVars,
               List<Js::SharedContents_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
               *sharedContentsList)

{
  ScriptContext *scriptContext;
  undefined1 local_60 [8];
  StreamSerializationCloner cloner;
  
  scriptContext = (writer->super_ScriptContextHolder).m_scriptContext;
  local_60._0_4_ = 0x1000000;
  cloner.m_sharedContentsrList =
       (List<Js::SharedContents_*,_Memory::HeapAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
        *)cTransferableVars;
  StreamWriter::Write<unsigned_int>(writer,(uint *)local_60);
  SerializationCloner<Js::StreamWriter>::SerializationCloner
            ((SerializationCloner<Js::StreamWriter> *)local_60,scriptContext,writer,
             sharedContentsList);
  SCAEngine<void_*,_unsigned_int,_Js::SerializationCloner<Js::StreamWriter>_>::Clone
            (root,(SerializationCloner<Js::StreamWriter> *)local_60,transferableVars,
             (size_t)cloner.m_sharedContentsrList);
  return;
}

Assistant:

void SCASerializationEngine::Serialize(Var root, StreamWriter* writer, Var* transferableVars, size_t cTransferableVars,
        JsUtil::List<Js::SharedContents*, HeapAllocator>* sharedContentsList)
    {
        ScriptContext* scriptContext = writer->GetScriptContext();

        // Write version
        writer->Write(static_cast<uint32>(SCA_FORMAT_VERSION));

        StreamSerializationCloner cloner(scriptContext, writer, sharedContentsList);
        SCAEngine<Var, scaposition_t, StreamSerializationCloner>::Clone(root, &cloner, transferableVars, cTransferableVars);
    }